

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

CosLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_cos(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x2cb) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x2cb;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    CosLayerParams::CosLayerParams(this_00.cos_);
    (this->layer_).cos_ = (CosLayerParams *)this_00;
  }
  return (CosLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::CosLayerParams* NeuralNetworkLayer::mutable_cos() {
  if (!has_cos()) {
    clear_layer();
    set_has_cos();
    layer_.cos_ = new ::CoreML::Specification::CosLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.cos)
  return layer_.cos_;
}